

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilPerm.c
# Opt level: O2

int Abc_ZddCountNodesArray(Abc_ZddMan *p,Vec_Int_t *vNodes)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar2 = 0;
  for (iVar3 = 0; iVar1 = vNodes->nSize, iVar3 < iVar1; iVar3 = iVar3 + 1) {
    iVar1 = Vec_IntEntry(vNodes,iVar3);
    iVar1 = Abc_ZddCount_rec(p,iVar1);
    iVar2 = iVar2 + iVar1;
  }
  for (iVar3 = 0; iVar3 < iVar1; iVar3 = iVar3 + 1) {
    iVar1 = Vec_IntEntry(vNodes,iVar3);
    Abc_ZddUnmark_rec(p,iVar1);
    iVar1 = vNodes->nSize;
  }
  return iVar2;
}

Assistant:

int Abc_ZddCountNodesArray( Abc_ZddMan * p, Vec_Int_t * vNodes )
{
    int i, Id, Count = 0;
    Vec_IntForEachEntry( vNodes, Id, i )
        Count += Abc_ZddCount_rec( p, Id );
    Vec_IntForEachEntry( vNodes, Id, i )
        Abc_ZddUnmark_rec( p, Id );
    return Count;
}